

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall
cfd::core::Address::Address
          (Address *this,NetType_conflict type,WitnessVersion witness_ver,SchnorrPubkey *pubkey,
          AddressFormatData *network_parameter)

{
  AddressType *args_1;
  AddressFormatData *in_stack_ffffffffffffff08;
  AddressFormatData *in_stack_ffffffffffffff10;
  string local_98;
  CfdSourceLocation local_78;
  string local_60;
  allocator local_29;
  AddressFormatData *local_28;
  AddressFormatData *network_parameter_local;
  SchnorrPubkey *pubkey_local;
  WitnessVersion witness_ver_local;
  NetType_conflict type_local;
  Address *this_local;
  
  this->type_ = type;
  this->addr_type_ = kTaprootAddress;
  this->witness_ver_ = witness_ver;
  local_28 = network_parameter;
  network_parameter_local = (AddressFormatData *)pubkey;
  pubkey_local._0_4_ = witness_ver;
  pubkey_local._4_4_ = type;
  _witness_ver_local = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&this->address_,"",&local_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_29);
  ByteData::ByteData(&this->hash_);
  Pubkey::Pubkey(&this->pubkey_);
  SchnorrPubkey::SchnorrPubkey(&this->schnorr_pubkey_,(SchnorrPubkey *)network_parameter_local);
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  Script::Script(&this->redeem_script_);
  AddressFormatData::AddressFormatData(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  this->checksum_[0] = '\0';
  this->checksum_[1] = '\0';
  this->checksum_[2] = '\0';
  this->checksum_[3] = '\0';
  SetNetType(this,&this->format_data_);
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_60,local_28);
  CalculateTaproot(this,&local_60);
  ::std::__cxx11::string::~string((string *)&local_60);
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_address.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x23e;
  local_78.funcname = "Address";
  args_1 = &this->addr_type_;
  AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_98,local_28);
  logger::info<cfd::core::NetType&,cfd::core::AddressType&,std::__cxx11::string>
            (&local_78,"call Address({},{},{})",&this->type_,args_1,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

Address::Address(
    NetType type, WitnessVersion witness_ver, const SchnorrPubkey& pubkey,
    const AddressFormatData& network_parameter)
    : type_(type),
      addr_type_(AddressType::kTaprootAddress),
      witness_ver_(witness_ver),
      address_(""),
      hash_(),
      pubkey_(),
      schnorr_pubkey_(pubkey),
      redeem_script_(),
      format_data_(network_parameter) {
  memset(checksum_, 0, sizeof(checksum_));
  SetNetType(format_data_);
  CalculateTaproot(network_parameter.GetBech32Hrp());
  info(
      CFD_LOG_SOURCE, "call Address({},{},{})", type_, addr_type_,
      network_parameter.GetBech32Hrp());
}